

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiID *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiID IVar5;
  ImGuiTabBarSortItem *pIVar6;
  ImGuiWindow *pIVar7;
  ImVec2 IVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ImGuiID IVar15;
  ImGuiID IVar16;
  ImGuiID IVar17;
  ImGuiTabItemFlags IVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  bool bVar21;
  bool bVar22;
  int iVar23;
  ImGuiTabItem *in_RAX;
  ImGuiTabItem *pIVar24;
  ImGuiTabItem *extraout_RAX;
  ImGuiTabBarSortItem *__dest;
  long lVar25;
  ImGuiTabItem *extraout_RAX_00;
  ImGuiTabItem *extraout_RAX_01;
  ImGuiTabItem *pIVar26;
  ImGuiTabItem *pIVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  ImGuiID IVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  ImGuiTabItem *pIVar35;
  uint uVar36;
  int iVar37;
  int iVar38;
  bool bVar39;
  bool bVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  ImGuiTabItem item_tmp;
  ImVec4 local_88;
  undefined4 uStack_78;
  undefined8 uStack_74;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImVec4 local_48;
  
  pIVar20 = GImGui;
  tab_bar->WantLayout = false;
  uVar30 = (tab_bar->Tabs).Size;
  if ((int)uVar30 < 1) {
    uVar28 = 0;
  }
  else {
    in_RAX = (ImGuiTabItem *)0x0;
    uVar29 = 0;
    uVar28 = 0;
    do {
      pIVar27 = (tab_bar->Tabs).Data;
      pIVar2 = (ImGuiID *)((long)&in_RAX->ID + (long)&pIVar27->ID);
      if (*(int *)((long)&pIVar27->LastFrameVisible + (long)in_RAX) < tab_bar->PrevFrameVisible) {
        if (*pIVar2 == tab_bar->SelectedTabId) {
          tab_bar->SelectedTabId = 0;
        }
      }
      else {
        if (uVar29 != uVar28) {
          IVar5 = pIVar2[0];
          IVar15 = pIVar2[1];
          IVar16 = pIVar2[2];
          IVar17 = pIVar2[3];
          IVar31 = pIVar2[4];
          uVar9 = *(undefined8 *)(pIVar2 + 5);
          pIVar24 = pIVar27 + (int)uVar28;
          pIVar24->LastFrameSelected = pIVar2[3];
          pIVar24->Offset = (float)IVar31;
          *(undefined8 *)(&pIVar24->LastFrameSelected + 2) = uVar9;
          pIVar27 = pIVar27 + (int)uVar28;
          pIVar27->ID = IVar5;
          pIVar27->Flags = IVar15;
          pIVar27->LastFrameVisible = IVar16;
          pIVar27->LastFrameSelected = IVar17;
        }
        uVar28 = uVar28 + 1;
      }
      uVar29 = uVar29 + 1;
      uVar30 = (tab_bar->Tabs).Size;
      in_RAX = in_RAX + 1;
    } while ((long)uVar29 < (long)(int)uVar30);
  }
  if (uVar30 != uVar28) {
    uVar30 = (tab_bar->Tabs).Capacity;
    in_RAX = (ImGuiTabItem *)(ulong)uVar30;
    if ((int)uVar30 < (int)uVar28) {
      if (uVar30 == 0) {
        uVar36 = 8;
      }
      else {
        uVar36 = (int)uVar30 / 2 + uVar30;
      }
      if ((int)uVar36 <= (int)uVar28) {
        uVar36 = uVar28;
      }
      if ((int)uVar30 < (int)uVar36) {
        pIVar24 = (ImGuiTabItem *)MemAlloc((long)(int)uVar36 * 0x1c);
        pIVar27 = (tab_bar->Tabs).Data;
        in_RAX = pIVar24;
        if (pIVar27 != (ImGuiTabItem *)0x0) {
          memcpy(pIVar24,pIVar27,(long)(tab_bar->Tabs).Size * 0x1c);
          MemFree((tab_bar->Tabs).Data);
          in_RAX = extraout_RAX;
        }
        (tab_bar->Tabs).Data = pIVar24;
        (tab_bar->Tabs).Capacity = uVar36;
      }
    }
    (tab_bar->Tabs).Size = uVar28;
  }
  IVar31 = tab_bar->NextSelectedTabId;
  if (IVar31 == 0) {
    IVar31 = 0;
  }
  else {
    tab_bar->SelectedTabId = IVar31;
    tab_bar->NextSelectedTabId = 0;
  }
  IVar5 = tab_bar->ReorderRequestTabId;
  if (IVar5 != 0) {
    uVar29 = (ulong)(tab_bar->Tabs).Size;
    bVar39 = 0 < (long)uVar29;
    if (0 < (long)uVar29) {
      in_RAX = (tab_bar->Tabs).Data;
      bVar39 = true;
      if (in_RAX->ID != IVar5) {
        pIVar24 = in_RAX + (uVar29 - 1);
        pIVar27 = in_RAX;
        uVar34 = 1;
        do {
          uVar32 = uVar34;
          in_RAX = pIVar24;
          if (uVar29 == uVar32) break;
          in_RAX = pIVar27 + 1;
          pIVar26 = pIVar27 + 1;
          pIVar27 = in_RAX;
          uVar34 = uVar32 + 1;
        } while (pIVar26->ID != IVar5);
        bVar39 = uVar32 < uVar29;
      }
    }
    if ((bVar39) && (in_RAX != (ImGuiTabItem *)0x0)) {
      pIVar27 = (tab_bar->Tabs).Data;
      uVar30 = (int)((ulong)((long)in_RAX - (long)pIVar27) >> 2) * -0x49249249 +
               tab_bar->ReorderRequestDir;
      if ((-1 < (int)uVar30) && ((int)uVar30 < (tab_bar->Tabs).Size)) {
        local_88.x = (float)in_RAX->ID;
        local_88.y = (float)in_RAX->Flags;
        uVar10 = in_RAX->LastFrameVisible;
        uVar11 = in_RAX->LastFrameSelected;
        uVar12 = in_RAX->Offset;
        uStack_74._0_4_ = in_RAX->Width;
        uStack_74._4_4_ = in_RAX->WidthContents;
        pIVar24 = pIVar27 + uVar30;
        IVar5 = pIVar24->ID;
        IVar18 = pIVar24->Flags;
        iVar38 = pIVar24->LastFrameVisible;
        iVar23 = pIVar24->LastFrameSelected;
        pIVar24 = pIVar27 + uVar30;
        fVar42 = pIVar24->Offset;
        uVar9 = *(undefined8 *)(&pIVar24->LastFrameSelected + 2);
        in_RAX->LastFrameSelected = pIVar24->LastFrameSelected;
        in_RAX->Offset = fVar42;
        *(undefined8 *)&in_RAX->Width = uVar9;
        in_RAX->ID = IVar5;
        in_RAX->Flags = IVar18;
        in_RAX->LastFrameVisible = iVar38;
        in_RAX->LastFrameSelected = iVar23;
        pIVar24 = pIVar27 + uVar30;
        pIVar24->ID = (ImGuiID)local_88.x;
        pIVar24->Flags = (ImGuiTabItemFlags)local_88.y;
        pIVar24->LastFrameVisible = uVar10;
        pIVar24->LastFrameSelected = uVar11;
        pIVar24 = pIVar27 + uVar30;
        pIVar24->LastFrameSelected = uVar11;
        pIVar24->Offset = (float)uVar12;
        *(undefined8 *)(&pIVar24->LastFrameSelected + 2) = uStack_74;
        local_88.z = (float)uVar10;
        local_88.w = (float)uVar11;
        uStack_78 = uVar12;
        if (pIVar27[uVar30].ID == tab_bar->SelectedTabId) {
          IVar31 = pIVar27[uVar30].ID;
        }
      }
      if ((tab_bar->Flags & 0x800000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  iVar38 = (tab_bar->Tabs).Size;
  iVar23 = (pIVar20->TabSortByWidthBuffer).Capacity;
  if (iVar23 < iVar38) {
    if (iVar23 == 0) {
      iVar37 = 8;
    }
    else {
      iVar37 = iVar23 / 2 + iVar23;
    }
    if (iVar37 <= iVar38) {
      iVar37 = iVar38;
    }
    if (iVar23 < iVar37) {
      __dest = (ImGuiTabBarSortItem *)MemAlloc((long)iVar37 << 3);
      pIVar6 = (pIVar20->TabSortByWidthBuffer).Data;
      if (pIVar6 != (ImGuiTabBarSortItem *)0x0) {
        memcpy(__dest,pIVar6,(long)(pIVar20->TabSortByWidthBuffer).Size << 3);
        MemFree((pIVar20->TabSortByWidthBuffer).Data);
      }
      (pIVar20->TabSortByWidthBuffer).Data = __dest;
      (pIVar20->TabSortByWidthBuffer).Capacity = iVar37;
    }
  }
  (pIVar20->TabSortByWidthBuffer).Size = iVar38;
  iVar23 = (tab_bar->Tabs).Size;
  lVar25 = (long)iVar23;
  if (lVar25 < 1) {
    pIVar27 = (ImGuiTabItem *)0x0;
    bVar39 = true;
    fVar42 = 0.0;
  }
  else {
    pIVar24 = (tab_bar->Tabs).Data;
    IVar5 = tab_bar->SelectedTabId;
    pIVar6 = (pIVar20->TabSortByWidthBuffer).Data;
    fVar42 = 0.0;
    lVar33 = 0;
    pIVar27 = (ImGuiTabItem *)0x0;
    bVar39 = false;
    do {
      if ((pIVar27 == (ImGuiTabItem *)0x0) ||
         (pIVar27->LastFrameSelected < pIVar24->LastFrameSelected)) {
        pIVar27 = pIVar24;
      }
      if (pIVar24->ID == IVar5) {
        bVar39 = true;
      }
      if (lVar33 == 0) {
        fVar48 = 0.0;
      }
      else {
        fVar48 = (pIVar20->Style).ItemInnerSpacing.x;
      }
      fVar43 = pIVar24->WidthContents;
      fVar42 = fVar42 + fVar48 + fVar43;
      pIVar6[lVar33].Index = (int)lVar33;
      pIVar6[lVar33].Width = fVar43;
      lVar33 = lVar33 + 1;
      pIVar24 = pIVar24 + 1;
    } while (lVar25 != lVar33);
    bVar39 = !bVar39;
  }
  fVar48 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  fVar42 = (float)(-(uint)(fVar48 < fVar42) & (uint)(fVar42 - fVar48));
  if ((fVar42 <= 0.0) || ((tab_bar->Flags & 0x40) == 0)) {
    if (0 < iVar23) {
      fVar42 = GImGui->FontSize * 20.0;
      pIVar24 = (tab_bar->Tabs).Data;
      lVar33 = 0;
      do {
        fVar48 = *(float *)((long)&pIVar24->WidthContents + lVar33);
        if (fVar42 <= fVar48) {
          fVar48 = fVar42;
        }
        *(float *)((long)&pIVar24->Width + lVar33) = fVar48;
        lVar33 = lVar33 + 0x1c;
      } while (lVar25 * 0x1c != lVar33);
    }
  }
  else {
    if (1 < iVar23) {
      qsort((pIVar20->TabSortByWidthBuffer).Data,(long)iVar38,8,TabBarSortItemComparer);
    }
    uVar30 = (tab_bar->Tabs).Size;
    uVar29 = 1;
    do {
      uVar28 = (uint)uVar29;
      if ((int)uVar30 <= (int)uVar28) break;
      pIVar6 = (pIVar20->TabSortByWidthBuffer).Data;
      fVar48 = pIVar6->Width;
      uVar29 = (ulong)(int)uVar28;
      if ((fVar48 != pIVar6[uVar29].Width) ||
         (uVar34 = uVar29, NAN(fVar48) || NAN(pIVar6[uVar29].Width))) {
        bVar40 = true;
      }
      else {
        do {
          uVar28 = uVar28 + 1;
          uVar29 = (ulong)uVar28;
          if (uVar30 == uVar28) goto LAB_00153ddf;
          uVar29 = uVar34 + 1;
          lVar25 = uVar34 + 1;
        } while ((fVar48 == pIVar6[lVar25].Width) &&
                (uVar34 = uVar29, !NAN(fVar48) && !NAN(pIVar6[lVar25].Width)));
        bVar40 = (long)uVar29 < (long)(int)uVar30;
      }
      if (bVar40) {
        pIVar6 = (pIVar20->TabSortByWidthBuffer).Data;
        fVar48 = pIVar6->Width - pIVar6[(int)uVar29].Width;
        uVar29 = uVar29 & 0xffffffff;
      }
      else {
        uVar29 = uVar29 & 0xffffffff;
LAB_00153ddf:
        fVar48 = ((pIVar20->TabSortByWidthBuffer).Data)->Width + -1.0;
      }
      fVar46 = (float)(int)uVar29;
      fVar43 = fVar42 / fVar46;
      if (fVar48 <= fVar43) {
        fVar43 = fVar48;
      }
      if (0 < (int)uVar29) {
        pIVar6 = (pIVar20->TabSortByWidthBuffer).Data;
        uVar34 = 0;
        do {
          pIVar6[uVar34].Width = pIVar6[uVar34].Width - fVar43;
          uVar34 = uVar34 + 1;
        } while (uVar29 != uVar34);
      }
      fVar42 = fVar42 - fVar43 * fVar46;
    } while (0.0 < fVar42);
    lVar25 = (long)(tab_bar->Tabs).Size;
    if (0 < lVar25) {
      pIVar6 = (pIVar20->TabSortByWidthBuffer).Data;
      pIVar24 = (tab_bar->Tabs).Data;
      lVar33 = 0;
      do {
        pIVar24[pIVar6[lVar33].Index].Width = (float)(int)pIVar6[lVar33].Width;
        lVar33 = lVar33 + 1;
      } while (lVar25 != lVar33);
    }
  }
  iVar38 = (tab_bar->Tabs).Size;
  if ((long)iVar38 < 1) {
    fVar42 = 0.0;
  }
  else {
    pIVar24 = (tab_bar->Tabs).Data;
    fVar48 = (pIVar20->Style).ItemInnerSpacing.x;
    fVar42 = 0.0;
    lVar25 = 0;
    do {
      *(float *)((long)&pIVar24->Offset + lVar25) = fVar42;
      if (IVar31 == 0) {
        IVar31 = *(ImGuiID *)((long)&pIVar24->ID + lVar25);
        if (pIVar20->NavJustMovedToId != IVar31) {
          IVar31 = 0;
        }
      }
      fVar42 = fVar42 + *(float *)((long)&pIVar24->Width + lVar25) + fVar48;
      lVar25 = lVar25 + 0x1c;
    } while ((long)iVar38 * 0x1c != lVar25);
  }
  fVar42 = fVar42 - (pIVar20->Style).ItemInnerSpacing.x;
  fVar42 = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
  tab_bar->OffsetMax = fVar42;
  tab_bar->OffsetNextTab = 0.0;
  pIVar19 = GImGui;
  if (((iVar38 < 2) ||
      (fVar48 = (tab_bar->BarRect).Min.x, fVar42 <= (tab_bar->BarRect).Max.x - fVar48)) ||
     ((tab_bar->Flags & 0x90U) != 0x80)) goto LAB_001541fd;
  pIVar7 = GImGui->CurrentWindow;
  fVar47 = GImGui->FontSize + -2.0;
  fVar42 = (GImGui->Style).FramePadding.y;
  fVar41 = fVar47 + fVar47;
  fVar43 = (tab_bar->BarRect).Max.x;
  fVar46 = (pIVar7->DC).CursorPos.x;
  bVar40 = false;
  if (((fVar48 <= fVar46) && (fVar48 = (pIVar7->DC).CursorPos.y, (tab_bar->BarRect).Min.y <= fVar48)
      ) && (fVar46 + fVar41 <= fVar43)) {
    bVar40 = fVar48 <= (tab_bar->BarRect).Max.y;
  }
  local_58 = ZEXT416((uint)fVar47);
  local_68.y = fVar42 + fVar42 + GImGui->FontSize;
  local_68.x = fVar47;
  uStack_60 = 0;
  IVar8 = (pIVar7->DC).CursorPos;
  if (!bVar40) {
    local_88.x = (GImGui->Style).ItemInnerSpacing.x + fVar43;
    local_88.y = (tab_bar->BarRect).Max.y + 0.0;
    PushClipRect(&(tab_bar->BarRect).Min,(ImVec2 *)&local_88,true);
  }
  local_88.x = (pIVar19->Style).Colors[0].x;
  local_88.y = (pIVar19->Style).Colors[0].y;
  uVar13 = (pIVar19->Style).Colors[0].z;
  uVar14 = (pIVar19->Style).Colors[0].w;
  local_88.w = (float)uVar14 * 0.5;
  local_88.z = (float)uVar13;
  PushStyleColor(0,&local_88);
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_48.z = 0.0;
  local_48.w = 0.0;
  PushStyleColor(0x15,&local_48);
  fVar48 = (pIVar19->IO).KeyRepeatDelay;
  fVar43 = (pIVar19->IO).KeyRepeatRate;
  (pIVar19->IO).KeyRepeatDelay = 0.25;
  (pIVar19->IO).KeyRepeatRate = 0.2;
  fVar42 = (tab_bar->BarRect).Min.y;
  (pIVar7->DC).CursorPos.x = (tab_bar->BarRect).Max.x - fVar41;
  (pIVar7->DC).CursorPos.y = fVar42;
  bVar21 = ArrowButtonEx("##<",0,local_68,5);
  fVar42 = (tab_bar->BarRect).Min.y;
  (pIVar7->DC).CursorPos.x = (float)local_58._0_4_ + ((tab_bar->BarRect).Max.x - fVar41);
  (pIVar7->DC).CursorPos.y = fVar42;
  bVar22 = ArrowButtonEx("##>",1,local_68,5);
  iVar38 = -(uint)bVar21;
  if (bVar22) {
    iVar38 = 1;
  }
  PopStyleColor(2);
  (pIVar19->IO).KeyRepeatDelay = fVar48;
  (pIVar19->IO).KeyRepeatRate = fVar43;
  pIVar24 = extraout_RAX_00;
  if (!bVar40) {
    PopClipRect();
    pIVar24 = extraout_RAX_01;
  }
  if (iVar38 == 0) {
    pIVar26 = (ImGuiTabItem *)0x0;
  }
  else {
    IVar5 = tab_bar->SelectedTabId;
    if (IVar5 == 0) {
LAB_00154181:
      pIVar24 = (ImGuiTabItem *)0x0;
    }
    else {
      uVar29 = (ulong)(tab_bar->Tabs).Size;
      bVar40 = 0 < (long)uVar29;
      if (0 < (long)uVar29) {
        pIVar24 = (tab_bar->Tabs).Data;
        bVar40 = true;
        if (pIVar24->ID != IVar5) {
          pIVar35 = pIVar24 + (uVar29 - 1);
          pIVar26 = pIVar24;
          uVar34 = 0;
          do {
            uVar32 = uVar29;
            pIVar24 = pIVar35;
            if (uVar29 - 1 == uVar34) break;
            pIVar24 = pIVar26 + 1;
            uVar32 = uVar34 + 1;
            pIVar1 = pIVar26 + 1;
            pIVar26 = pIVar24;
            uVar34 = uVar32;
          } while (pIVar1->ID != IVar5);
          bVar40 = uVar32 < uVar29;
        }
      }
      if (!bVar40) goto LAB_00154181;
    }
    if (pIVar24 == (ImGuiTabItem *)0x0) {
      pIVar26 = (ImGuiTabItem *)0x0;
    }
    else {
      pIVar26 = (tab_bar->Tabs).Data;
      iVar23 = (int)((ulong)((long)pIVar24 - (long)pIVar26) >> 2) * -0x49249249;
      iVar38 = iVar38 + iVar23;
      if ((iVar38 < 0) || ((tab_bar->Tabs).Size <= iVar38)) {
        iVar38 = iVar23;
      }
      pIVar26 = pIVar26 + iVar38;
    }
  }
  (pIVar7->DC).CursorPos = IVar8;
  (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - (fVar41 + 1.0);
  if (pIVar26 != (ImGuiTabItem *)0x0) {
    IVar31 = pIVar26->ID;
    tab_bar->SelectedTabId = IVar31;
  }
LAB_001541fd:
  if (bVar39) {
    tab_bar->SelectedTabId = 0;
  }
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (pIVar27 != (ImGuiTabItem *)0x0)) {
    IVar31 = pIVar27->ID;
    tab_bar->SelectedTabId = IVar31;
  }
  pIVar27 = (ImGuiTabItem *)(ulong)tab_bar->SelectedTabId;
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if (IVar31 != 0) {
    uVar29 = (ulong)(tab_bar->Tabs).Size;
    bVar39 = 0 < (long)uVar29;
    if (0 < (long)uVar29) {
      pIVar27 = (tab_bar->Tabs).Data;
      bVar39 = true;
      if (pIVar27->ID != IVar31) {
        pIVar26 = pIVar27 + (uVar29 - 1);
        pIVar24 = pIVar27;
        uVar34 = 1;
        do {
          uVar32 = uVar34;
          pIVar27 = pIVar26;
          if (uVar29 == uVar32) break;
          pIVar27 = pIVar24 + 1;
          pIVar35 = pIVar24 + 1;
          pIVar24 = pIVar27;
          uVar34 = uVar32 + 1;
        } while (pIVar35->ID != IVar31);
        bVar39 = uVar32 < uVar29;
      }
    }
    if ((bVar39) && (pIVar27 != (ImGuiTabItem *)0x0)) {
      fVar42 = GImGui->FontSize;
      iVar38 = (int)((ulong)((long)pIVar27 - (long)(tab_bar->Tabs).Data) >> 2) * -0x49249249;
      fVar48 = fVar42;
      if (iVar38 < 1) {
        fVar48 = -0.0;
      }
      fVar48 = pIVar27->Offset - fVar48;
      if ((tab_bar->Tabs).Size <= iVar38 + 1) {
        fVar42 = 1.0;
      }
      fVar42 = pIVar27->Offset + pIVar27->Width + fVar42;
      if (fVar48 < tab_bar->ScrollingTarget) {
        tab_bar->ScrollingTarget = fVar48;
      }
      fVar48 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
      if (tab_bar->ScrollingTarget + fVar48 < fVar42) {
        tab_bar->ScrollingTarget = fVar42 - fVar48;
      }
    }
  }
  auVar45._0_4_ = tab_bar->OffsetMax - ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x);
  uVar3 = tab_bar->ScrollingAnim;
  uVar4 = tab_bar->ScrollingTarget;
  auVar44._4_4_ = uVar4;
  auVar44._0_4_ = uVar3;
  auVar44._8_8_ = 0;
  auVar45._4_4_ = auVar45._0_4_;
  auVar45._8_4_ = auVar45._0_4_;
  auVar45._12_4_ = auVar45._0_4_;
  auVar45 = minps(auVar44,auVar45);
  fVar42 = (float)(-(uint)(0.0 <= auVar45._0_4_) & (uint)auVar45._0_4_);
  fVar48 = (float)(-(uint)(0.0 <= auVar45._4_4_) & (uint)auVar45._4_4_);
  tab_bar->ScrollingAnim = fVar42;
  tab_bar->ScrollingTarget = fVar48;
  if (tab_bar->PrevFrameVisible + 1 < pIVar20->FrameCount) {
    fVar43 = 3.4028235e+38;
  }
  else {
    fVar43 = (pIVar20->IO).DeltaTime * pIVar20->FontSize * 70.0;
  }
  if ((fVar42 != fVar48) || (NAN(fVar42) || NAN(fVar48))) {
    if (fVar48 <= fVar42) {
      fVar46 = fVar42;
      if (fVar48 < fVar42) {
        uVar30 = -(uint)(fVar48 <= fVar42 - fVar43);
        fVar46 = (float)((uint)(fVar42 - fVar43) & uVar30 | ~uVar30 & (uint)fVar48);
      }
    }
    else {
      fVar46 = fVar42 + fVar43;
      if (fVar48 <= fVar42 + fVar43) {
        fVar46 = fVar48;
      }
    }
    tab_bar->ScrollingAnim = fVar46;
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately if we can (for manual tab bar, WidthContent will lag by one frame which is mostly noticeable when changing style.FramePadding.x)
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet, 
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    const float scrolling_speed = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) ? FLT_MAX : (g.IO.DeltaTime * g.FontSize * 70.0f);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
        tab_bar->ScrollingAnim = ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, scrolling_speed);
}